

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::ChangeColumnTypeInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ChangeColumnTypeInfo *this)

{
  bool bVar1;
  ExtraTypeInfo *pEVar2;
  pointer pPVar3;
  string local_40;
  optional_ptr<duckdb::ExtraTypeInfo,_true> extra_type_info;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_40);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.field_0xa == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ParseInfo::QualifierToString
            (&local_40,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  KeywordHelper::WriteOptionallyQuoted(&local_40,&this->column_name,'\"',true);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar1 = LogicalType::IsValid(&this->target_type);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_(&local_40,&this->target_type);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  extra_type_info.ptr =
       (this->target_type).type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (extra_type_info.ptr != (element_type *)0x0) {
    pEVar2 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&extra_type_info);
    if (pEVar2->type == STRING_TYPE_INFO) {
      pEVar2 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&extra_type_info);
      if (*(long *)&pEVar2[1].type != 0) {
        ::std::operator+(&local_40," COLLATE ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pEVar2 + 1));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_40);
      }
    }
  }
  if ((this->expression).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->expression);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(&local_40,pPVar3);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ChangeColumnTypeInfo::ToString() const {
	string result = "";
	result += "ALTER TABLE ";
	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		result += " IF EXISTS";
	}
	result += QualifierToString(catalog, schema, name);
	result += " ALTER COLUMN ";
	result += KeywordHelper::WriteOptionallyQuoted(column_name);
	result += " TYPE ";
	if (target_type.IsValid()) {
		result += target_type.ToString();
	}
	auto extra_type_info = target_type.AuxInfo();
	if (extra_type_info && extra_type_info->type == ExtraTypeInfoType::STRING_TYPE_INFO) {
		auto &string_info = extra_type_info->Cast<StringTypeInfo>();
		if (!string_info.collation.empty()) {
			result += " COLLATE " + string_info.collation;
		}
	}
	if (expression) {
		result += " USING ";
		result += expression->ToString();
	}
	result += ";";
	return result;
}